

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * bc_realloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  pvVar1 = realloc(ptr,size);
  if (size == 0 || pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  fwrite("fatal: Failed to reallocate memory!\n",0x24,1,_stderr);
  free(ptr);
  abort();
}

Assistant:

void*
bc_realloc(void *ptr, size_t size)
{
    // simple things even simpler :P
    void *rv = realloc(ptr, size);
    if (rv == NULL && size != 0) {
        fprintf(stderr, "fatal: Failed to reallocate memory!\n");
        free(ptr);
        abort();
    }
    return rv;
}